

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_sign(wally_psbt *psbt,uchar *key,size_t key_len,uint32_t flags)

{
  size_t value_len;
  wally_psbt_input *pwVar1;
  wally_tx_input *pwVar2;
  long lVar3;
  wally_tx *tx;
  uint64_t *puVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  uchar *puVar10;
  undefined8 unaff_RBX;
  size_t index;
  long lVar11;
  uint uVar12;
  wally_map *pwVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  int local_1d4;
  size_t scriptcode_len;
  size_t keypath_index;
  ulong local_1b0;
  wally_map *local_1a8;
  size_t is_found;
  uint local_198;
  uint32_t local_194;
  uchar *local_190;
  size_t local_188;
  wally_map *local_180;
  uchar signature_hash [32];
  uchar pubkey [33];
  size_t type;
  uchar p2sh [23];
  uchar wpkh_sc [25];
  uchar full_pubkey [65];
  
  iVar7 = -2;
  iVar6 = -2;
  if ((((psbt != (wally_psbt *)0x0) && (iVar6 = iVar7, key != (uchar *)0x0)) && (flags < 0x10)) &&
     ((key_len == 0x20 && (psbt->tx != (wally_tx *)0x0)))) {
    bVar16 = psbt->magic[4] != 0xff || *(int *)psbt->magic != 0x74657370;
    puVar9 = (uchar *)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar16);
    iVar6 = wally_ec_public_key_from_private_key(key,0x20,pubkey,0x21);
    if (iVar6 == 0) {
      iVar6 = wally_ec_public_key_decompress(pubkey,0x21,full_pubkey,0x41);
    }
    if (iVar6 == 0) {
      if (psbt->num_inputs != 0) {
        local_198 = (uint)bVar16;
        local_194 = (flags & 4) + 1;
        lVar15 = 0x48;
        lVar11 = 0;
        index = 0;
        local_190 = key;
        do {
          pwVar1 = psbt->inputs;
          pwVar2 = psbt->tx->inputs;
          keypath_index = 0;
          pwVar13 = (wally_map *)((long)&pwVar1->utxo + lVar15);
          iVar6 = wally_map_find(pwVar13,full_pubkey,0x41,&keypath_index);
          if ((iVar6 == 0) && (keypath_index == 0)) {
            iVar6 = wally_map_find(pwVar13,pubkey,0x21,&keypath_index);
          }
          bVar16 = false;
          iVar7 = local_1d4;
          local_1a8 = pwVar13;
          if ((iVar6 == 0) && (keypath_index != 0)) {
            keypath_index = keypath_index - 1;
            pwVar13 = (wally_map *)((long)&pwVar1->redeem_script_len + lVar15);
            iVar6 = wally_map_find(pwVar13,full_pubkey,0x41,&is_found);
            if ((iVar6 == 0) && (is_found == 0)) {
              iVar6 = wally_map_find(pwVar13,pubkey,0x21,&is_found);
            }
            bVar16 = false;
            local_180 = pwVar13;
            if ((iVar6 == 0) && (is_found == 0)) {
              if (pwVar1 == (wally_psbt_input *)0x0) {
LAB_00109306:
                bVar17 = false;
              }
              else {
                uVar8 = (ulong)*(uint *)(pwVar2->txhash + lVar11 + 0x20);
                scriptcode_len = 0;
                lVar14 = *(long *)((long)pwVar1 + lVar15 + -0x48);
                if (lVar14 != 0) {
                  if (uVar8 < *(ulong *)(lVar14 + 0x28)) {
                    lVar14 = uVar8 * 0x70 + *(long *)(lVar14 + 0x20);
                    goto LAB_00109295;
                  }
LAB_00109304:
                  puVar9 = (uchar *)0x0;
                  goto LAB_00109306;
                }
                lVar14 = 0;
LAB_00109295:
                lVar3 = *(long *)((long)pwVar1 + lVar15 + -0x40);
                if (lVar3 != 0) {
                  lVar14 = lVar3;
                }
                if (lVar14 == 0) goto LAB_00109304;
                puVar9 = *(uchar **)((long)pwVar1 + lVar15 + -0x38);
                if (puVar9 == (uchar *)0x0) {
                  puVar9 = *(uchar **)(lVar14 + 8);
                  scriptcode_len = *(size_t *)(lVar14 + 0x10);
                }
                else {
                  iVar6 = wally_scriptpubkey_p2sh_from_bytes
                                    (puVar9,*(size_t *)((long)pwVar1 + lVar15 + -0x30),1,p2sh,0x17,
                                     &type);
                  if (((iVar6 != 0) || (*(size_t *)(lVar14 + 0x10) != type)) ||
                     (iVar6 = bcmp(p2sh,*(void **)(lVar14 + 8),type), iVar6 != 0))
                  goto LAB_00109304;
                  puVar9 = *(uchar **)((long)pwVar1 + lVar15 + -0x38);
                  scriptcode_len = *(size_t *)((long)pwVar1 + lVar15 + -0x30);
                }
                bVar17 = true;
              }
              bVar16 = true;
              iVar7 = -2;
              if (bVar17) {
                iVar6 = *(int *)((long)&(pwVar1->keypaths).items + lVar15);
                uVar8 = (ulong)(iVar6 + (uint)(iVar6 == 0));
                if (*(long *)((long)pwVar1 + lVar15 + -0x40) == 0) {
                  tx = *(wally_tx **)((long)pwVar1 + lVar15 + -0x48);
                  if (tx == (wally_tx *)0x0) goto LAB_0010958c;
                  local_1b0 = uVar8;
                  _Var5 = is_matching_txid(tx,pwVar2->txhash + lVar11,uVar8);
                  if (_Var5) {
                    iVar7 = wally_tx_get_btc_signature_hash
                                      (psbt->tx,index,puVar9,scriptcode_len,0,(uint32_t)local_1b0,0,
                                       signature_hash,0x20);
                    if (iVar7 == 0) goto LAB_0010958c;
                  }
                  else {
                    iVar7 = -2;
                  }
                }
                else {
                  local_1b0 = uVar8;
                  iVar6 = wally_scriptpubkey_get_type(puVar9,scriptcode_len,&type);
                  if (iVar6 == 0) {
                    if (type == 0x10) {
                      if (*(long *)((long)pwVar1 + lVar15 + -0x28) != 0) {
                        iVar6 = wally_witness_program_from_bytes
                                          (*(uchar **)((long)pwVar1 + lVar15 + -0x28),
                                           *(size_t *)((long)pwVar1 + lVar15 + -0x20),2,p2sh,0x22,
                                           (size_t *)signature_hash);
                        puVar10 = puVar9;
                        if ((iVar6 == 0) && (iVar6 = -2, scriptcode_len == 0x22)) {
                          iVar6 = bcmp(p2sh,puVar9,0x22);
                          if (iVar6 == 0) {
                            puVar10 = *(uchar **)((long)pwVar1 + lVar15 + -0x28);
                            scriptcode_len = *(size_t *)((long)pwVar1 + lVar15 + -0x20);
                            bVar17 = true;
                          }
                          else {
                            bVar17 = false;
                            local_1d4 = -2;
                          }
                        }
                        else {
                          local_1d4 = iVar6;
                          bVar17 = false;
                        }
                        puVar9 = puVar10;
                        iVar6 = local_1d4;
                        if (bVar17) goto LAB_0010952c;
                        goto LAB_00109577;
                      }
                      bVar17 = false;
                      local_1d4 = -2;
                    }
                    else {
                      iVar6 = -2;
                      if (type != 8) goto LAB_00109577;
                      iVar6 = wally_scriptpubkey_p2pkh_from_bytes
                                        (puVar9 + 2,0x14,0,wpkh_sc,0x19,&scriptcode_len);
                      puVar10 = wpkh_sc;
                      if (iVar6 == 0) {
LAB_0010952c:
                        puVar4 = *(uint64_t **)((long)pwVar1 + lVar15 + -0x40);
                        if (local_198 == 0) {
                          iVar6 = wally_tx_get_elements_signature_hash
                                            (psbt->tx,index,puVar10,scriptcode_len,
                                             (uchar *)puVar4[6],puVar4[7],(uint32_t)local_1b0,1,
                                             signature_hash,0x20);
                        }
                        else {
                          iVar6 = wally_tx_get_btc_signature_hash
                                            (psbt->tx,index,puVar10,scriptcode_len,*puVar4,
                                             (uint32_t)local_1b0,1,signature_hash,0x20);
                        }
                        bVar17 = iVar6 == 0;
                        puVar9 = puVar10;
                        if (!bVar17) {
                          local_1d4 = iVar6;
                        }
                      }
                      else {
                        bVar17 = false;
                        local_1d4 = iVar6;
                      }
                    }
                  }
                  else {
LAB_00109577:
                    bVar17 = false;
                    local_1d4 = iVar6;
                  }
                  iVar7 = local_1d4;
                  if (bVar17) {
LAB_0010958c:
                    if (pwVar1 == (wally_psbt_input *)0x0) {
                      uVar12 = 1;
                    }
                    else {
                      iVar6 = *(int *)((long)&(pwVar1->keypaths).items + lVar15);
                      uVar12 = iVar6 + (uint)(iVar6 == 0);
                    }
                    iVar6 = -2;
                    if (local_190 != (uchar *)0x0 && pwVar1 != (wally_psbt_input *)0x0) {
                      puVar10 = local_1a8->items[keypath_index].key;
                      local_1a8 = (wally_map *)local_1a8->items[keypath_index].key_len;
                      iVar7 = wally_ec_public_key_verify(puVar10,(size_t)local_1a8);
                      if (((uVar12 < 0x100) && (iVar7 == 0)) &&
                         ((iVar6 = wally_ec_sig_from_bytes
                                             (local_190,0x20,signature_hash,0x20,local_194,
                                              (uchar *)&type,0x40), iVar6 == 0 &&
                          (iVar6 = wally_ec_sig_to_der((uchar *)&type,0x40,p2sh,0x49,&local_188),
                          iVar6 == 0)))) {
                        value_len = local_188 + 1;
                        p2sh[local_188] = (uchar)uVar12;
                        local_188 = value_len;
                        iVar6 = map_add(local_180,puVar10,(size_t)local_1a8,p2sh,value_len,false,
                                        (_func_int_uchar_ptr_size_t *)0x0,true);
                        wally_clear_2(&type,0x40,p2sh,0x49);
                      }
                    }
                    bVar16 = iVar6 != 0;
                    iVar7 = local_1d4;
                    if (bVar16) {
                      iVar7 = iVar6;
                    }
                  }
                }
              }
            }
          }
          local_1d4 = iVar7;
          if (bVar16) {
            return local_1d4;
          }
          index = index + 1;
          lVar11 = lVar11 + 0xd0;
          lVar15 = lVar15 + 0x110;
        } while (index < psbt->num_inputs);
      }
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int wally_psbt_sign(struct wally_psbt *psbt,
                    const unsigned char *key, size_t key_len, uint32_t flags)
{
    unsigned char pubkey[EC_PUBLIC_KEY_LEN], full_pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    const size_t pubkey_len = sizeof(pubkey), full_pubkey_len = sizeof(full_pubkey);
    unsigned char wpkh_sc[WALLY_SCRIPTPUBKEY_P2PKH_LEN];
    size_t is_elements, i;
    int ret;

    if (!psbt || !psbt->tx || !key || key_len != EC_PRIVATE_KEY_LEN ||
        (flags & ~EC_FLAGS_ALL)) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;
#ifndef BUILD_ELEMENTS
    if (is_elements)
        return WALLY_EINVAL;
#endif /* ndef BUILD_ELEMENTS */

    /* Get the pubkey */
    ret = wally_ec_public_key_from_private_key(key, key_len,
                                               pubkey, pubkey_len);
    if (ret == WALLY_OK)
        ret = wally_ec_public_key_decompress(pubkey, pubkey_len,
                                             full_pubkey, full_pubkey_len);
    if (ret != WALLY_OK)
        return ret;

    /* Go through each of the inputs */
    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *txin = &psbt->tx->inputs[i];
        unsigned char signature_hash[SHA256_LEN];
        const unsigned char *scriptcode;
        size_t keypath_index = 0, scriptcode_len;
        uint32_t sighash;

        /* See if this input has a keypath matching the pubkey of the private key supplied */
        ret = wally_map_find(&input->keypaths, full_pubkey, full_pubkey_len, &keypath_index);
        if (ret == WALLY_OK && !keypath_index)
            ret = wally_map_find(&input->keypaths, pubkey, pubkey_len, &keypath_index);
        if (ret != WALLY_OK)
            continue;

        if (!keypath_index)
            continue; /* Didn't find a keypath matching this pubkey: skip it */
        keypath_index -= 1; /* Use 0 based index below */

        /* Make sure we don't already have a sig for this input */
        size_t is_found;
        ret = wally_map_find(&input->signatures, full_pubkey, full_pubkey_len, &is_found);
        if (ret == WALLY_OK && !is_found)
            ret = wally_map_find(&input->signatures, pubkey, pubkey_len, &is_found);

        if (ret != WALLY_OK || is_found)
            continue; /* Already got a partial sig for this pubkey on this input */

        /* From this point, any failure to sign returns an error, since we
        * have the key to sign this input we are expected to be able to */

        if (!input_get_scriptcode(input, txin->index, &scriptcode, &scriptcode_len))
            return WALLY_EINVAL; /* Couldn't find the script to sign with */

        sighash = input->sighash ? input->sighash : WALLY_SIGHASH_ALL;

        if (input->witness_utxo) {
            size_t type;

            ret = wally_scriptpubkey_get_type(scriptcode, scriptcode_len, &type);
            if (ret != WALLY_OK)
                return ret;

            if (type == WALLY_SCRIPT_TYPE_P2WPKH) {
                ret = wally_scriptpubkey_p2pkh_from_bytes(&scriptcode[2],
                                                          HASH160_LEN, 0,
                                                          wpkh_sc, sizeof(wpkh_sc),
                                                          &scriptcode_len);
                if (ret != WALLY_OK)
                    return ret;

                scriptcode = wpkh_sc;
            } else if (type == WALLY_SCRIPT_TYPE_P2WSH && input->witness_script) {
                unsigned char p2wsh[WALLY_SCRIPTPUBKEY_P2WSH_LEN];
                size_t written;

                ret = wally_witness_program_from_bytes(input->witness_script,
                                                       input->witness_script_len,
                                                       WALLY_SCRIPT_SHA256,
                                                       p2wsh, sizeof(p2wsh),
                                                       &written);
                if (ret != WALLY_OK)
                    return ret;

                if (scriptcode_len != sizeof(p2wsh) ||
                    memcmp(p2wsh, scriptcode, sizeof(p2wsh)))
                    return WALLY_EINVAL;

                scriptcode = input->witness_script;
                scriptcode_len = input->witness_script_len;
            } else
                return WALLY_EINVAL; /* Unknown scriptPubKey type/not enough info */

#ifdef BUILD_ELEMENTS
            if (is_elements)
                ret = wally_tx_get_elements_signature_hash(psbt->tx, i,
                                                           scriptcode, scriptcode_len,
                                                           input->witness_utxo->value,
                                                           input->witness_utxo->value_len,
                                                           sighash,
                                                           WALLY_TX_FLAG_USE_WITNESS,
                                                           signature_hash, SHA256_LEN);
            else
#endif /* BUILD_ELEMENTS */
            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  input->witness_utxo->satoshi,
                                                  sighash,
                                                  WALLY_TX_FLAG_USE_WITNESS,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        } else if (input->utxo) {
            if (!is_matching_txid(input->utxo,
                                  txin->txhash, sizeof(txin->txhash)))
                return WALLY_EINVAL; /* prevout doesn't match this input */

            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  0, sighash, 0,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        }

        ret = psbt_input_sign(input, key, key_len,
                              input->keypaths.items[keypath_index].key,
                              input->keypaths.items[keypath_index].key_len,
                              signature_hash, SHA256_LEN, flags);
        if (ret != WALLY_OK)
            return ret;
    }

    return WALLY_OK;
}